

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Read.h
# Opt level: O1

void __thiscall Read::Read(Read *this,string *name,Token *token)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_30;
  
  local_30._M_dataplus._M_p = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == paVar1) {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_30.field_2._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  }
  else {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_30._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  AST::ASTNode::ASTNode(&this->super_ASTNode,&local_30,token);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR_accept_0014da28;
  return;
}

Assistant:

Read(std::string name, Token *token) : ASTNode(std::move(name), token) {}